

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O0

void __thiscall jaegertracing::samplers::Config::fromEnv(Config *this)

{
  bool bVar1;
  long *plVar2;
  ulong uVar3;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 local_208 [8];
  string samplingServerURL;
  double paramVal;
  istringstream iss;
  undefined1 local_60 [8];
  string param;
  undefined1 local_30 [8];
  string samplerType;
  Config *this_local;
  
  samplerType.field_2._8_8_ = this;
  utils::EnvVariable::getStringVariable_abi_cxx11_
            ((string *)local_30,(EnvVariable *)"JAEGER_SAMPLER_TYPE",in_RDX);
  auVar5 = std::__cxx11::string::empty();
  pcVar4 = auVar5._8_8_;
  if ((auVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::string::operator=((string *)this,(string *)local_30);
    pcVar4 = extraout_RDX;
  }
  utils::EnvVariable::getStringVariable_abi_cxx11_
            ((string *)local_60,(EnvVariable *)"JAEGER_SAMPLER_PARAM",pcVar4);
  auVar5 = std::__cxx11::string::empty();
  pcVar4 = auVar5._8_8_;
  if ((auVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::istringstream::istringstream((istringstream *)&paramVal,(string *)local_60,_S_in);
    samplingServerURL.field_2._8_8_ = 0;
    plVar2 = (long *)std::istream::operator>>
                               (&paramVal,(double *)((long)&samplingServerURL.field_2 + 8));
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (bVar1) {
      this->_param = (double)samplingServerURL.field_2._8_8_;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&paramVal);
    pcVar4 = extraout_RDX_00;
  }
  utils::EnvVariable::getStringVariable_abi_cxx11_
            ((string *)local_208,(EnvVariable *)"JAEGER_SAMPLING_ENDPOINT",pcVar4);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)&this->_samplingServerURL,(string *)local_208);
  }
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void Config::fromEnv()
{
    const auto samplerType = utils::EnvVariable::getStringVariable(kJAEGER_SAMPLER_TYPE_ENV_PROP);
    if (!samplerType.empty()) {
        _type = samplerType;
    }

    const auto param = utils::EnvVariable::getStringVariable(kJAEGER_SAMPLER_PARAM_ENV_PROP);
    if (!param.empty()) {
        std::istringstream iss(param);
        double paramVal = 0;
        if (iss >> paramVal) {
            _param = paramVal;
        }
    }
    const auto samplingServerURL = utils::EnvVariable::getStringVariable(kJAEGER_SAMPLING_ENDPOINT_ENV_PROP);
    if (!samplingServerURL.empty()) {
        _samplingServerURL = samplingServerURL;
    }
}